

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ex_camera.c
# Opt level: O3

void add_quad(double x,double y,double z,double u,double v,double ux,double uy,double uz,double uu,
             double uv,double vx,double vy,double vz,double vu,double vv,ALLEGRO_COLOR c1,
             ALLEGRO_COLOR c2)

{
  double x_00;
  double y_00;
  double z_00;
  double u_00;
  double v_00;
  ALLEGRO_COLOR color;
  ALLEGRO_COLOR color_00;
  ALLEGRO_COLOR color_01;
  ALLEGRO_COLOR color_02;
  ALLEGRO_COLOR color_03;
  ALLEGRO_COLOR color_04;
  
  color._8_8_ = vv;
  color._0_8_ = vz;
  add_vertex(x,y,z,u,v,color);
  x_00 = ux + x;
  y_00 = y + 0.0;
  z_00 = uy + z;
  u_00 = uz + u;
  v_00 = v + 0.0;
  color_00._8_8_ = vv;
  color_00._0_8_ = vz;
  add_vertex(x_00,y_00,z_00,u_00,v_00,color_00);
  color_01.b = c2.b;
  color_01.a = c2.a;
  color_01.r = c1.b;
  color_01.g = c1.a;
  add_vertex(x + 0.0,y + uu,z + uv,u + 0.0,v + vx,color_01);
  color_02.b = c2.b;
  color_02.a = c2.a;
  color_02.r = c1.b;
  color_02.g = c1.a;
  add_vertex(x + 0.0,y + uu,z + uv,u + 0.0,v + vx,color_02);
  color_03._8_8_ = vv;
  color_03._0_8_ = vz;
  add_vertex(x_00,y_00,z_00,u_00,v_00,color_03);
  color_04.b = c2.b;
  color_04.a = c2.a;
  color_04.r = c1.b;
  color_04.g = c1.a;
  add_vertex(x_00 + 0.0,y_00 + uu,z_00 + uv,u_00 + 0.0,v_00 + vx,color_04);
  return;
}

Assistant:

static void add_quad(double x, double y, double z, double u, double v,
   double ux, double uy, double uz, double uu, double uv,
   double vx, double vy, double vz, double vu, double vv,
   ALLEGRO_COLOR c1, ALLEGRO_COLOR c2)
{
   add_vertex(x, y, z, u, v, c1);
   add_vertex(x + ux, y + uy, z + uz, u + uu, v + uv, c1);
   add_vertex(x + vx, y + vy, z + vz, u + vu, v + vv, c2);
   add_vertex(x + vx, y + vy, z + vz, u + vu, v + vv, c2);
   add_vertex(x + ux, y + uy, z + uz, u + uu, v + uv, c1);
   add_vertex(x + ux + vx, y + uy + vy, z + uz + vz, u + uu + vu,
      v + uv + vv, c2);
}